

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpprotocolhandler.cpp
# Opt level: O3

bool __thiscall QHttpProtocolHandler::sendRequest(QHttpProtocolHandler *this)

{
  QHttpNetworkConnectionChannel **ppQVar1;
  qint64 *pqVar2;
  ChannelState CVar3;
  QHttpNetworkReply *pQVar4;
  QHttpNetworkReplyPrivate *this_00;
  QObject *pQVar5;
  Data *pDVar6;
  QHttpNetworkConnectionPrivate *this_01;
  totally_ordered_wrapper<QHttpNetworkRequestPrivate_*> tVar7;
  storage_type_conflict *psVar8;
  QMetaTypeInterface *pQVar9;
  QIODevice *pQVar10;
  bool bVar11;
  bool bVar12;
  char cVar13;
  byte bVar14;
  int fromChannel;
  ProxyType PVar15;
  QSslSocket *this_02;
  long lVar16;
  long lVar17;
  char *s;
  Data *pDVar18;
  QHttpNetworkRequestPrivate *pQVar19;
  QNonContiguousByteDevice *pQVar20;
  qint64 qVar21;
  QHttpNetworkConnectionChannel *pQVar22;
  qint64 headerSize;
  QString *url_00;
  QAuthenticator *this_03;
  QArrayData *pQVar23;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *this_04;
  long in_FS_OFFSET;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  qint64 currentReadSize;
  QUrl url;
  QByteArray __old_val;
  NetworkError local_dc;
  QObject local_c8 [8];
  QString local_c0;
  QArrayData *local_a8;
  storage_type_conflict *local_a0;
  long local_98;
  QArrayData *local_90 [2];
  long local_80;
  QString local_78;
  undefined1 local_60 [16];
  storage_type_conflict *psStack_50;
  QMetaTypeInterface *local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar22 = (this->super_QAbstractProtocolHandler).m_channel;
  pQVar4 = pQVar22->reply;
  (this->super_QAbstractProtocolHandler).m_reply = pQVar4;
  if (pQVar4 == (QHttpNetworkReply *)0x0) {
    sendRequest();
LAB_0020e2cf:
    bVar12 = false;
    goto LAB_0020e632;
  }
  ppQVar1 = &(this->super_QAbstractProtocolHandler).m_channel;
  CVar3 = pQVar22->state;
  bVar12 = true;
  if (CVar3 == WaitingState) {
    pQVar20 = QHttpNetworkRequest::uploadByteDevice(&pQVar22->request);
    if (pQVar20 != (QNonContiguousByteDevice *)0x0) {
      QObject::disconnect((QObject *)pQVar20,"2readyRead()",&(*ppQVar1)->super_QObject,
                          "1_q_uploadDataReadyRead()");
    }
    lVar16 = (**(code **)(*(long *)(this->super_QAbstractProtocolHandler).m_socket + 0xa0))();
    if (lVar16 != 0) {
      local_60._8_8_ = (QHttpNetworkRequestPrivate *)0x0;
      psStack_50 = (storage_type_conflict *)0x0;
      local_48[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (&(*ppQVar1)->super_QObject,"_q_receiveReply",QueuedConnection,1,
                 (void **)(local_60 + 8),(char **)&psStack_50,local_48);
    }
    goto LAB_0020e632;
  }
  if (CVar3 == WritingState) {
    pQVar20 = QHttpNetworkRequest::uploadByteDevice(&pQVar22->request);
    if ((pQVar20 == (QNonContiguousByteDevice *)0x0) ||
       ((*ppQVar1)->bytesTotal == (*ppQVar1)->written)) {
      pQVar9 = (QMetaTypeInterface *)(this->m_header).d.size;
      if (pQVar9 != (QMetaTypeInterface *)0x0) {
        pQVar10 = (this->super_QAbstractProtocolHandler).m_socket;
        local_60._8_8_ = (this->m_header).d.d;
        psStack_50 = (storage_type_conflict *)(this->m_header).d.ptr;
        (this->m_header).d.d = (Data *)0x0;
        (this->m_header).d.ptr = (char *)0x0;
        (this->m_header).d.size = 0;
        local_48[0] = pQVar9;
        QIODevice::write((QByteArray *)pQVar10);
        if ((QHttpNetworkRequestPrivate *)local_60._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
          LOCK();
          *(int *)local_60._8_8_ = *(int *)local_60._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_60._8_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_60._8_8_,1,0x10);
          }
        }
      }
      bVar12 = true;
      pQVar22 = *ppQVar1;
      if (pQVar20 != (QNonContiguousByteDevice *)0x0) {
        QHttpNetworkReply::dataSendProgress
                  ((QHttpNetworkReply *)(this->super_QAbstractProtocolHandler).m_reply,
                   pQVar22->written,pQVar22->bytesTotal);
        pQVar22 = (this->super_QAbstractProtocolHandler).m_channel;
      }
      pQVar22->state = WaitingState;
      (*(this->super_QAbstractProtocolHandler)._vptr_QAbstractProtocolHandler[4])(this);
      goto LAB_0020e632;
    }
    this_02 = (QSslSocket *)QMetaObject::cast((QObject *)&QSslSocket::staticMetaObject);
    do {
      lVar16 = (**(code **)(*(long *)(this->super_QAbstractProtocolHandler).m_socket + 0xa8))();
      if (this_02 == (QSslSocket *)0x0) {
        lVar17 = 0;
      }
      else {
        lVar17 = QSslSocket::encryptedBytesToWrite(this_02);
      }
      if ((0x8000 < lVar17 + lVar16) ||
         (lVar16 = (*ppQVar1)->bytesTotal - (*ppQVar1)->written, lVar16 == 0)) goto LAB_0020e630;
      local_78.d.d = (Data *)0x0;
      if (0x3fff < lVar16) {
        lVar16 = 0x4000;
      }
      s = (char *)(**(code **)(*(long *)pQVar20 + 0x60))(pQVar20,lVar16,&local_78);
      if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0xffffffffffffffff) {
        local_dc = UnknownNetworkError;
LAB_0020e2b6:
        QHttpNetworkConnectionPrivate::emitReplyError
                  (*(QHttpNetworkConnectionPrivate **)
                    &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8,
                   (this->super_QAbstractProtocolHandler).m_socket,
                   (this->super_QAbstractProtocolHandler).m_reply,local_dc);
        goto LAB_0020e2cf;
      }
      if ((s == (char *)0x0) || (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0))
      goto LAB_0020e630;
      local_dc = UnknownNetworkError;
      lVar16 = (*ppQVar1)->written;
      lVar17 = (**(code **)(*(long *)pQVar20 + 0x78))(pQVar20);
      if (lVar16 != lVar17) {
        sendRequest();
        local_dc = ProtocolFailure;
        goto LAB_0020e2b6;
      }
      lVar16 = (this->m_header).d.size;
      if (lVar16 == 0) {
        pQVar23 = (QArrayData *)
                  QIODevice::write((char *)(this->super_QAbstractProtocolHandler).m_socket,
                                   (longlong)s);
      }
      else {
        QByteArray::append(&this->m_header,s,(qsizetype)local_78.d.d);
        pQVar10 = (this->super_QAbstractProtocolHandler).m_socket;
        local_60._8_8_ = (this->m_header).d.d;
        psStack_50 = (storage_type_conflict *)(this->m_header).d.ptr;
        local_48[0] = (QMetaTypeInterface *)(this->m_header).d.size;
        (this->m_header).d.d = (Data *)0x0;
        (this->m_header).d.ptr = (char *)0x0;
        (this->m_header).d.size = 0;
        lVar17 = QIODevice::write((QByteArray *)pQVar10);
        if ((QHttpNetworkRequestPrivate *)local_60._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
          LOCK();
          *(int *)local_60._8_8_ = *(int *)local_60._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_60._8_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_60._8_8_,1,0x10);
          }
        }
        pQVar23 = (QArrayData *)(lVar17 - lVar16);
        if (lVar17 == -1) {
          pQVar23 = (QArrayData *)0xffffffffffffffff;
        }
        local_60._8_8_ = (QHttpNetworkRequestPrivate *)0x0;
        psStack_50 = (storage_type_conflict *)0x0;
        local_48[0] = (QMetaTypeInterface *)0x0;
        QMetaObject::invokeMethodImpl
                  (&((this->super_QAbstractProtocolHandler).m_reply)->super_QObject,"requestSent",
                   QueuedConnection,1,(void **)(local_60 + 8),(char **)&psStack_50,local_48);
      }
      if ((pQVar23 == (QArrayData *)0xffffffffffffffff) ||
         (pQVar23 != &(local_78.d.d)->super_QArrayData)) goto LAB_0020e2b6;
      pqVar2 = &((this->super_QAbstractProtocolHandler).m_channel)->written;
      *pqVar2 = (long)&(pQVar23->ref_)._q_value.super___atomic_base<int>._M_i + *pqVar2;
      (**(code **)(*(long *)pQVar20 + 0x68))(pQVar20,pQVar23);
      pQVar22 = (this->super_QAbstractProtocolHandler).m_channel;
      QHttpNetworkReply::dataSendProgress
                ((QHttpNetworkReply *)(this->super_QAbstractProtocolHandler).m_reply,
                 pQVar22->written,pQVar22->bytesTotal);
      pQVar22 = (this->super_QAbstractProtocolHandler).m_channel;
    } while (pQVar22->written != pQVar22->bytesTotal);
LAB_0020e620:
    pQVar22->state = WaitingState;
  }
  else {
    if (CVar3 != IdleState) goto LAB_0020e632;
    bVar11 = QHttpNetworkConnectionChannel::ensureConnection
                       ((QHttpNetworkConnectionChannel *)pQVar22);
    if (!bVar11) goto LAB_0020e2cf;
    bVar11 = QHttpNetworkRequest::isPreConnect(&(*ppQVar1)->request);
    pQVar22 = *ppQVar1;
    if (bVar11) {
      pQVar22->state = IdleState;
      *(undefined4 *)(*(long *)&((this->super_QAbstractProtocolHandler).m_reply)->field_0x8 + 0xd0)
           = 4;
      QHttpNetworkConnectionChannel::allDone((QHttpNetworkConnectionChannel *)pQVar22);
      QHttpNetworkConnection::preConnectFinished
                ((QHttpNetworkConnection *)(this->super_QAbstractProtocolHandler).m_connection);
      (this->super_QAbstractProtocolHandler).m_reply = (QHttpNetworkReply *)0x0;
      goto LAB_0020e632;
    }
    pQVar22->written = 0;
    pQVar22->bytesTotal = 0;
    this_00 = *(QHttpNetworkReplyPrivate **)
               &((this->super_QAbstractProtocolHandler).m_reply)->field_0x8;
    QHttpNetworkReplyPrivate::clear(this_00);
    pQVar5 = &((this->super_QAbstractProtocolHandler).m_connection)->super_QObject;
    if (pQVar5 == (QObject *)0x0) {
      pDVar18 = (Data *)0x0;
    }
    else {
      pDVar18 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar5);
    }
    pDVar6 = (this_00->connection).wp.d;
    (this_00->connection).wp.d = pDVar18;
    (this_00->connection).wp.value = pQVar5;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar6->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar6);
      }
    }
    pQVar22 = *ppQVar1;
    if (pQVar22 == (QHttpNetworkConnectionChannel *)0x0) {
      pDVar18 = (Data *)0x0;
    }
    else {
      pDVar18 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar22->super_QObject);
    }
    pDVar6 = (this_00->connectionChannel).wp.d;
    (this_00->connectionChannel).wp.d = pDVar18;
    (this_00->connectionChannel).wp.value = &pQVar22->super_QObject;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar6->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar6);
      }
    }
    pQVar19 = ((*ppQVar1)->request).d.d.ptr;
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar19->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>
          .super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1) {
      this_04 = &((*ppQVar1)->request).d;
      QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(this_04);
      pQVar19 = (this_04->d).ptr;
    }
    this_00->autoDecompress = pQVar19->autoDecompress;
    this_00->pipeliningUsed = false;
    QHttpNetworkRequest::url((QHttpNetworkRequest *)&local_78);
    QUrl::userInfo(local_60 + 8,(QHttpNetworkRequest *)&local_78,0);
    if (local_48[0] == (QMetaTypeInterface *)0x0) {
      if ((QHttpNetworkRequestPrivate *)local_60._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
        LOCK();
        *(int *)local_60._8_8_ = *(int *)local_60._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_60._8_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_60._8_8_,2,0x10);
        }
      }
      url_00 = &local_78;
LAB_0020e471:
      QUrl::~QUrl((QUrl *)url_00);
    }
    else {
      bVar12 = QHttpNetworkRequest::withCredentials(&(*ppQVar1)->request);
      if ((QHttpNetworkRequestPrivate *)local_60._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
        LOCK();
        *(int *)local_60._8_8_ = *(int *)local_60._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_60._8_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_60._8_8_,2,0x10);
        }
      }
      QUrl::~QUrl((QUrl *)&local_78);
      if (bVar12) {
        local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QHttpNetworkRequest::url((QHttpNetworkRequest *)local_60);
        this_03 = &(*ppQVar1)->authenticator;
        QUrl::userName(local_60 + 8,(QHttpNetworkRequest *)local_60,0x7f00000);
        QAuthenticator::user(&local_78,this_03);
        bVar14 = 1;
        if ((local_48[0] == (QMetaTypeInterface *)local_78.d.size) &&
           (QVar24.m_data = psStack_50, QVar24.m_size = (qsizetype)local_48[0],
           QVar26.m_data = local_78.d.ptr, QVar26.m_size = (qsizetype)local_48[0],
           cVar13 = QtPrivate::equalStrings(QVar24,QVar26), cVar13 != '\0')) {
          QUrl::password(local_90,local_60,0x7f00000);
          if (local_80 == 0) {
            bVar14 = 0;
          }
          else {
            QUrl::password(&local_a8,local_60,0x7f00000);
            QAuthenticator::password(&local_c0,this_03);
            bVar14 = 1;
            if (local_98 == local_c0.d.size) {
              QVar25.m_data = local_a0;
              QVar25.m_size = local_98;
              QVar27.m_data = local_c0.d.ptr;
              QVar27.m_size = local_98;
              bVar14 = QtPrivate::equalStrings(QVar25,QVar27);
              bVar14 = bVar14 ^ 1;
            }
            if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_a8 != (QArrayData *)0x0) {
              LOCK();
              (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a8,2,0x10);
              }
            }
          }
          if (local_90[0] != (QArrayData *)0x0) {
            LOCK();
            (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_90[0],2,0x10);
            }
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
          UNLOCK();
          if (*(int *)local_78.d.d == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QHttpNetworkRequestPrivate *)local_60._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
          LOCK();
          *(int *)local_60._8_8_ = *(int *)local_60._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_60._8_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_60._8_8_,2,0x10);
          }
        }
        if (bVar14 != 0) {
          QUrl::userName((QString *)(local_60 + 8),local_60,0x7f00000);
          QAuthenticator::setUser(this_03,(QString *)(local_60 + 8));
          if ((QHttpNetworkRequestPrivate *)local_60._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
            LOCK();
            *(int *)local_60._8_8_ = *(int *)local_60._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_60._8_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_60._8_8_,2,0x10);
            }
          }
          QUrl::password((QString *)(local_60 + 8),local_60,0x7f00000);
          QAuthenticator::setPassword(this_03,(QString *)(local_60 + 8));
          if ((QHttpNetworkRequestPrivate *)local_60._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
            LOCK();
            *(int *)local_60._8_8_ = *(int *)local_60._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_60._8_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_60._8_8_,2,0x10);
            }
          }
          this_01 = *(QHttpNetworkConnectionPrivate **)
                     &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8;
          fromChannel = QHttpNetworkConnectionPrivate::indexOf
                                  (this_01,(this->super_QAbstractProtocolHandler).m_socket);
          QHttpNetworkConnectionPrivate::copyCredentials(this_01,fromChannel,this_03,false);
        }
        local_60._8_8_ = (QHttpNetworkRequestPrivate *)0x0;
        psStack_50 = (storage_type_conflict *)0x0;
        local_48[0] = (QMetaTypeInterface *)0x0;
        QUrl::setUserInfo((QString *)local_60,(int)local_60 + 8);
        if ((QHttpNetworkRequestPrivate *)local_60._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
          LOCK();
          *(int *)local_60._8_8_ = *(int *)local_60._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_60._8_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_60._8_8_,2,0x10);
          }
        }
        url_00 = (QString *)local_60;
        QHttpNetworkRequest::setUrl(&(*ppQVar1)->request,(QUrl *)url_00);
        goto LAB_0020e471;
      }
    }
    bVar12 = QHttpNetworkRequest::withCredentials(&(*ppQVar1)->request);
    if (bVar12) {
      QHttpNetworkConnectionPrivate::createAuthorization
                (*(QHttpNetworkConnectionPrivate **)
                  &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8,
                 (this->super_QAbstractProtocolHandler).m_socket,
                 &((this->super_QAbstractProtocolHandler).m_channel)->request);
    }
    pQVar22 = (this->super_QAbstractProtocolHandler).m_channel;
    PVar15 = QNetworkProxy::type((QNetworkProxy *)
                                 (*(long *)&((this->super_QAbstractProtocolHandler).m_connection)->
                                            field_0x8 + 0xc0));
    QHttpNetworkRequestPrivate::header
              ((QByteArray *)(local_60 + 8),&pQVar22->request,PVar15 != NoProxy);
    tVar7.ptr = (QHttpNetworkRequestPrivate *)(this->m_header).d.d;
    psVar8 = (storage_type_conflict *)(this->m_header).d.ptr;
    (this->m_header).d.d = (Data *)local_60._8_8_;
    (this->m_header).d.ptr = (char *)psStack_50;
    pQVar9 = (QMetaTypeInterface *)(this->m_header).d.size;
    (this->m_header).d.size = (qsizetype)local_48[0];
    local_60._8_8_ = tVar7.ptr;
    psStack_50 = psVar8;
    local_48[0] = pQVar9;
    if (tVar7.ptr != (QHttpNetworkRequestPrivate *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&((tVar7.ptr)->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref)
      ->_M_i = ((__atomic_base<int> *)
               &((tVar7.ptr)->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)
          &((tVar7.ptr)->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)tVar7.ptr,1,0x10);
      }
    }
    pQVar20 = QHttpNetworkRequest::uploadByteDevice(&(*ppQVar1)->request);
    if (pQVar20 == (QNonContiguousByteDevice *)0x0) {
      pQVar10 = (this->super_QAbstractProtocolHandler).m_socket;
      local_60._8_8_ = (this->m_header).d.d;
      psStack_50 = (storage_type_conflict *)(this->m_header).d.ptr;
      local_48[0] = (QMetaTypeInterface *)(this->m_header).d.size;
      (this->m_header).d.d = (Data *)0x0;
      (this->m_header).d.ptr = (char *)0x0;
      (this->m_header).d.size = 0;
      QIODevice::write((QByteArray *)pQVar10);
      if ((QHttpNetworkRequestPrivate *)local_60._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
        LOCK();
        *(int *)local_60._8_8_ = *(int *)local_60._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_60._8_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_60._8_8_,1,0x10);
        }
      }
      local_60._8_8_ = (QHttpNetworkRequestPrivate *)0x0;
      psStack_50 = (storage_type_conflict *)0x0;
      local_48[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (&((this->super_QAbstractProtocolHandler).m_reply)->super_QObject,"requestSent",
                 QueuedConnection,1,(void **)(local_60 + 8),(char **)&psStack_50,local_48);
      pQVar22 = (this->super_QAbstractProtocolHandler).m_channel;
      goto LAB_0020e620;
    }
    QObject::connect(local_c8,(char *)pQVar20,(QObject *)"2readyRead()",
                     (char *)(this->super_QAbstractProtocolHandler).m_channel,0x269f8f);
    QMetaObject::Connection::~Connection((Connection *)local_c8);
    qVar21 = QHttpNetworkRequest::contentLength
                       (&((this->super_QAbstractProtocolHandler).m_channel)->request);
    pQVar22 = (this->super_QAbstractProtocolHandler).m_channel;
    pQVar22->bytesTotal = qVar21;
    pQVar22->state = WritingState;
  }
  (*(this->super_QAbstractProtocolHandler)._vptr_QAbstractProtocolHandler[4])(this);
LAB_0020e630:
  bVar12 = true;
LAB_0020e632:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar12;
}

Assistant:

bool QHttpProtocolHandler::sendRequest()
{
    m_reply = m_channel->reply;

    if (!m_reply) {
        // heh, how should that happen!
        qWarning("QAbstractProtocolHandler::sendRequest() called without QHttpNetworkReply");
        return false;
    }

    switch (m_channel->state) {
    case QHttpNetworkConnectionChannel::IdleState: { // write the header
        if (!m_channel->ensureConnection()) {
            // wait for the connection (and encryption) to be done
            // sendRequest will be called again from either
            // _q_connected or _q_encrypted
            return false;
        }
        if (m_channel->request.isPreConnect()) {
            m_channel->state = QHttpNetworkConnectionChannel::IdleState;
            m_reply->d_func()->state = QHttpNetworkReplyPrivate::AllDoneState;
            m_channel->allDone();
            m_connection->preConnectFinished(); // will only decrease the counter
            m_reply = nullptr; // so we can reuse this channel
            return true; // we have a working connection and are done
        }

        m_channel->written = 0; // excluding the header
        m_channel->bytesTotal = 0;

        QHttpNetworkReplyPrivate *replyPrivate = m_reply->d_func();
        replyPrivate->clear();
        replyPrivate->connection = m_connection;
        replyPrivate->connectionChannel = m_channel;
        replyPrivate->autoDecompress = m_channel->request.d->autoDecompress;
        replyPrivate->pipeliningUsed = false;

        // if the url contains authentication parameters, use the new ones
        // both channels will use the new authentication parameters
        if (!m_channel->request.url().userInfo().isEmpty() && m_channel->request.withCredentials()) {
            QUrl url = m_channel->request.url();
            QAuthenticator &auth = m_channel->authenticator;
            if (url.userName() != auth.user()
                || (!url.password().isEmpty() && url.password() != auth.password())) {
                auth.setUser(url.userName());
                auth.setPassword(url.password());
                m_connection->d_func()->copyCredentials(m_connection->d_func()->indexOf(m_socket), &auth, false);
            }
            // clear the userinfo,  since we use the same request for resending
            // userinfo in url can conflict with the one in the authenticator
            url.setUserInfo(QString());
            m_channel->request.setUrl(url);
        }
        // Will only be false if Qt WebKit is performing a cross-origin XMLHttpRequest
        // and withCredentials has not been set to true.
        if (m_channel->request.withCredentials())
            m_connection->d_func()->createAuthorization(m_socket, m_channel->request);
#ifndef QT_NO_NETWORKPROXY
        m_header = QHttpNetworkRequestPrivate::header(m_channel->request,
            (m_connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy));
#else
        m_header = QHttpNetworkRequestPrivate::header(m_channel->request, false);
#endif

        // flushing is dangerous (QSslSocket calls transmit which might read or error)
//        m_socket->flush();
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (uploadByteDevice) {
            // connect the signals so this function gets called again
            QObject::connect(uploadByteDevice, SIGNAL(readyRead()), m_channel, SLOT(_q_uploadDataReadyRead()));

            m_channel->bytesTotal = m_channel->request.contentLength();

            m_channel->state = QHttpNetworkConnectionChannel::WritingState; // start writing data
            sendRequest(); //recurse
        } else {
            // no data to send: just send the HTTP headers
            m_socket->write(std::exchange(m_header, {}));
            QMetaObject::invokeMethod(m_reply, "requestSent", Qt::QueuedConnection);
            m_channel->state = QHttpNetworkConnectionChannel::WaitingState; // now wait for response
            sendRequest(); //recurse
        }

        break;
    }
    case QHttpNetworkConnectionChannel::WritingState:
    {
        // write the data
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (!uploadByteDevice || m_channel->bytesTotal == m_channel->written) {
            // the upload device might have no data to send, but we still have to send the headers,
            // do it now.
            if (!m_header.isEmpty())
                m_socket->write(std::exchange(m_header, {}));
            if (uploadByteDevice)
                emit m_reply->dataSendProgress(m_channel->written, m_channel->bytesTotal);
            m_channel->state = QHttpNetworkConnectionChannel::WaitingState; // now wait for response
            sendRequest(); // recurse
            break;
        }

        // only feed the QTcpSocket buffer when there is less than 32 kB in it;
        // note that the headers do not count towards these limits.
        const qint64 socketBufferFill = 32*1024;
        const qint64 socketWriteMaxSize = 16*1024;

        // if it is really an ssl socket, check more than just bytesToWrite()
#ifndef QT_NO_SSL
        QSslSocket *sslSocket = qobject_cast<QSslSocket*>(m_socket);
        const auto encryptedBytesToWrite = [sslSocket]() -> qint64
        {
            return sslSocket ? sslSocket->encryptedBytesToWrite() : 0;
        };
#else
        const auto encryptedBytesToWrite = [](){ return qint64(0); };
#endif

        // throughout this loop, we want to send the data coming from uploadByteDevice.
        // we also need to send the headers, as we try to coalesce their write with the data.
        // we won't send more than the limits above, excluding the headers
        while ((m_socket->bytesToWrite() + encryptedBytesToWrite()) <= socketBufferFill
               && m_channel->bytesTotal != m_channel->written)
        {
            // get pointer to upload data
            qint64 currentReadSize = 0;
            const qint64 desiredReadSize = qMin(socketWriteMaxSize, m_channel->bytesTotal - m_channel->written);
            const char *readPointer = uploadByteDevice->readPointer(desiredReadSize, currentReadSize);

            if (currentReadSize == -1) {
                // premature eof happened
                m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::UnknownNetworkError);
                return false;
            } else if (readPointer == nullptr || currentReadSize == 0) {
                // nothing to read currently, break the loop
                break;
            } else {
                if (m_channel->written != uploadByteDevice->pos()) {
                    // Sanity check. This was useful in tracking down an upload corruption.
                    qWarning() << "QHttpProtocolHandler: Internal error in sendRequest. Expected to write at position" << m_channel->written << "but read device is at" << uploadByteDevice->pos();
                    Q_ASSERT(m_channel->written == uploadByteDevice->pos());
                    m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::ProtocolFailure);
                    return false;
                }
                qint64 currentWriteSize;
                if (m_header.isEmpty()) {
                    currentWriteSize = m_socket->write(readPointer, currentReadSize);
                } else {
                    // assemble header and data and send them together
                    const qint64 headerSize = m_header.size();
                    m_header.append(readPointer, currentReadSize);
                    currentWriteSize = m_socket->write(std::exchange(m_header, {}));
                    if (currentWriteSize != -1)
                        currentWriteSize -= headerSize;
                    QMetaObject::invokeMethod(m_reply, "requestSent", Qt::QueuedConnection);
                }
                if (currentWriteSize == -1 || currentWriteSize != currentReadSize) {
                    // socket broke down
                    m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::UnknownNetworkError);
                    return false;
                } else {
                    m_channel->written += currentWriteSize;
                    uploadByteDevice->advanceReadPointer(currentWriteSize);

                    emit m_reply->dataSendProgress(m_channel->written, m_channel->bytesTotal);

                    if (m_channel->written == m_channel->bytesTotal) {
                        // make sure this function is called once again
                        m_channel->state = QHttpNetworkConnectionChannel::WaitingState;
                        sendRequest();
                        break;
                    }
                }
            }
        }
        break;
    }

    case QHttpNetworkConnectionChannel::WaitingState:
    {
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (uploadByteDevice) {
            QObject::disconnect(uploadByteDevice, SIGNAL(readyRead()), m_channel, SLOT(_q_uploadDataReadyRead()));
        }

        // HTTP pipelining
        //m_connection->d_func()->fillPipeline(m_socket);
        //m_socket->flush();

        // ensure we try to receive a reply in all cases, even if _q_readyRead_ hat not been called
        // this is needed if the sends an reply before we have finished sending the request. In that
        // case receiveReply had been called before but ignored the server reply
        if (m_socket->bytesAvailable())
            QMetaObject::invokeMethod(m_channel, "_q_receiveReply", Qt::QueuedConnection);
        break;
    }
    case QHttpNetworkConnectionChannel::ReadingState:
        // ignore _q_bytesWritten in these states
        Q_FALLTHROUGH();
    default:
        break;
    }
    return true;
}